

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_server.c
# Opt level: O2

void read_handler(cio_websocket *websocket,void *handler_context,cio_error err,size_t frame_length,
                 uint8_t *data,size_t chunk_length,_Bool last_chunk,_Bool last_frame,_Bool is_binary
                 )

{
  cio_websocket *wbh;
  cio_error cVar1;
  char *pcVar2;
  size_t sStackY_40;
  
  if (err == CIO_EOF) {
    return;
  }
  if (err == CIO_SUCCESS) {
    pcVar2 = "false";
    if (last_frame) {
      pcVar2 = "true";
    }
    fprintf(_stdout,"Got text message (last frame: %s):",pcVar2);
    fwrite(data,chunk_length,1,_stdout);
    fflush(_stdout);
    fputc(10,_stdout);
    wbh = websocket + 1;
    websocket[1].ws_private.remaining_read_frame_length = (size_t)wbh;
    websocket[1].ws_private.read_frame_length = (size_t)wbh;
    *(undefined8 *)&websocket[1].ws_private.ws_flags = 0;
    websocket[1].ws_private.read_handler = (cio_websocket_read_handler_t)0x0;
    websocket[1].ws_private.close_timer.close_hook = (cio_timer_close_hook_t)"Hello World!";
    websocket[1].ws_private.close_timer.handler = (cio_timer_handler_t)0xc;
    cio_write_buffer_insert
              ((cio_write_buffer *)wbh,
               (cio_write_buffer *)&websocket[1].ws_private.read_handler_context,
               (cio_write_buffer *)wbh,(cio_write_buffer *)wbh);
    cVar1 = cio_websocket_write_message_first_chunk
                      (websocket,(size_t)websocket[1].ws_private.read_handler,
                       (cio_write_buffer *)wbh,true,is_binary,write_complete,(void *)0x0);
    if (cVar1 == CIO_SUCCESS) {
      return;
    }
    pcVar2 = "Could not start writing message!\n";
    sStackY_40 = 0x21;
  }
  else {
    pcVar2 = "read failure!\n";
    sStackY_40 = 0xe;
  }
  fwrite(pcVar2,sStackY_40,1,_stderr);
  return;
}

Assistant:

static void read_handler(struct cio_websocket *websocket, void *handler_context, enum cio_error err, size_t frame_length, uint8_t *data, size_t chunk_length, bool last_chunk, bool last_frame, bool is_binary)
{
	(void)handler_context;
	(void)frame_length;
	(void)last_chunk;

	if (err == CIO_SUCCESS) {
		struct cio_websocket_location_handler *handler = cio_container_of(websocket, struct cio_websocket_location_handler, websocket);
		struct ws_echo_handler *echo_handler = cio_container_of(handler, struct ws_echo_handler, ws_handler);

		(void)fprintf(stdout, "Got text message (last frame: %s):", last_frame ? "true" : "false");
		(void)fwrite(data, chunk_length, 1, stdout);
		(void)fflush(stdout);
		(void)fprintf(stdout, "\n");

		static const char *text_message = "Hello World!";
		cio_write_buffer_head_init(&echo_handler->wbh);
		cio_write_buffer_const_element_init(&echo_handler->wb_message, text_message, strlen(text_message));
		cio_write_buffer_queue_tail(&echo_handler->wbh, &echo_handler->wb_message);
		err = cio_websocket_write_message_first_chunk(websocket, cio_write_buffer_get_total_size(&echo_handler->wbh), &echo_handler->wbh, true, is_binary, write_complete, NULL);
		if (err != CIO_SUCCESS) {
			(void)fprintf(stderr, "Could not start writing message!\n");
		}
	} else if (err != CIO_EOF) {
		(void)fprintf(stderr, "read failure!\n");
	}
}